

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O2

DOMNode * __thiscall xercesc_4_0::DOMAttrImpl::cloneNode(DOMAttrImpl *this,bool deep)

{
  DOMAttrImpl *this_00;
  
  this_00 = (DOMAttrImpl *)operator_new(0x70,(this->fParent).fOwnerDocument,ATTR_OBJECT);
  DOMAttrImpl(this_00,this,deep);
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_CLONED,(DOMNode *)this,(DOMNode *)this_00);
  return (DOMNode *)this_00;
}

Assistant:

DOMNode * DOMAttrImpl::cloneNode(bool deep) const
{
    DOMNode* newNode = new (fParent.fOwnerDocument, DOMDocumentImpl::ATTR_OBJECT) DOMAttrImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}